

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.cc
# Opt level: O3

void __thiscall Thread::Start(Thread *this)

{
  LogMessage local_190;
  
  if (this->running_ == true) {
    LogMessage::LogMessage
              (&local_190,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/util/thread.cc",
               0x18,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_190.str_,"Check failed: !running_",0x17);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_190);
  }
  pthread_create(&this->pid_,(pthread_attr_t *)0x0,startThread,this);
  this->running_ = true;
  if (this->joinable_ == false) {
    pthread_detach(this->pid_);
  }
  return;
}

Assistant:

void Thread::Start() {
  CHECK(!running_);
  pthread_create(&pid_, 0, startThread, this);
  running_ = true;
  if (!joinable_)
    pthread_detach(pid_);
}